

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_white_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float factor,rf_rand_proc rand,
          rf_color *dst,rf_int dst_size)

{
  rf_color *prVar1;
  uint uVar2;
  rf_int rVar3;
  rf_int i;
  ulong uVar4;
  
  uVar2 = height * width;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (((0 < (int)uVar2) && (rand != (rf_rand_proc)0x0)) && ((int)(uVar2 * 4) <= dst_size)) {
    uVar4 = 0;
    do {
      rVar3 = (*rand)(0,99);
      if (rVar3 < (int)(factor * 100.0)) {
        prVar1 = dst + uVar4;
        prVar1->r = 0xff;
        prVar1->g = 0xff;
        prVar1->b = 0xff;
        prVar1->a = 0xff;
      }
      else {
        dst[uVar4].r = '\0';
        dst[uVar4].g = '\0';
        dst[uVar4].b = '\0';
        dst[uVar4].a = 0xff;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_white_noise_to_buffer(int width, int height, float factor, rf_rand_proc rand, rf_color* dst, rf_int dst_size)
{
    int result_image_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    rf_image result = {0};

    if (dst_size < result_image_size || !rand || result_image_size <= 0) return result;

    for (rf_int i = 0; i < width * height; i++)
    {
        if (rand(0, 99) < (int)(factor * 100.0f))
        {
            dst[i] = RF_WHITE;
        }
        else
        {
            dst[i] = RF_BLACK;
        }
    }

    result = (rf_image)
    {
        .data = dst,
        .width = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid = true,
    };

    return result;
}